

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<int,long,8>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *lhs,long *rhs,int *result)

{
  int iVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int64_t tmp;
  
  lVar2 = (long)*in_RDI - *in_RSI;
  uVar3 = (undefined4)lVar2;
  if (*in_RDI < 0) {
    if (*in_RSI < 0) {
      iVar1 = std::numeric_limits<int>::max();
      if (lVar2 <= iVar1) {
        *in_RDX = uVar3;
        return;
      }
    }
    else if ((lVar2 <= *in_RDI) && (iVar1 = std::numeric_limits<int>::min(), iVar1 <= lVar2)) {
      *in_RDX = uVar3;
      return;
    }
  }
  else if (*in_RSI < 0) {
    if ((*in_RDI <= lVar2) && (iVar1 = std::numeric_limits<int>::max(), lVar2 <= iVar1)) {
      *in_RDX = uVar3;
      return;
    }
  }
  else {
    iVar1 = std::numeric_limits<int>::min();
    if (iVar1 <= lVar2) {
      *in_RDX = uVar3;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}